

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleObjectLookup.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  bool bVar1;
  Slice SVar2;
  ostream *poVar3;
  long lVar4;
  string_view attrName;
  string_view attrName_00;
  string_view attrName_01;
  string_view attrName_02;
  string_view attrName_03;
  string_view attrName_04;
  string_view attribute;
  string_view attribute_00;
  string_view attribute_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string_view attribute_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  string_view attribute_03;
  string_view attribute_04;
  string_view attribute_05;
  string_view attribute_06;
  allocator_type local_142;
  allocator<char> local_141;
  Slice s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100 [32];
  uint8_t *local_e0;
  Slice qux;
  Builder b;
  int iVar5;
  
  arangodb::velocypack::Builder::Builder(&b);
  arangodb::velocypack::Value::Value((Value *)&local_120,Object,false);
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&b,(Value *)&local_120);
  local_120._M_dataplus._M_p._0_1_ = 0xb;
  local_120._M_dataplus._M_p._4_4_ = 3;
  local_120._M_string_length = 0x2a;
  attrName._M_str = "foo";
  attrName._M_len = 3;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&b,attrName,(Value *)&local_120);
  local_120._M_dataplus._M_p._0_1_ = 0xe;
  local_120._M_dataplus._M_p._4_4_ = 6;
  local_120._M_string_length = 0x111044;
  attrName_00._M_str = "bar";
  attrName_00._M_len = 3;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&b,attrName_00,(Value *)&local_120);
  arangodb::velocypack::Value::Value((Value *)&local_120,Object,false);
  attrName_01._M_str = "baz";
  attrName_01._M_len = 3;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&b,attrName_01,(Value *)&local_120);
  local_120._M_dataplus._M_p._0_1_ = 3;
  local_120._M_dataplus._M_p._4_4_ = 1;
  local_120._M_string_length = CONCAT71(local_120._M_string_length._1_7_,1);
  attrName_02._M_str = "qux";
  attrName_02._M_len = 3;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&b,attrName_02,(Value *)&local_120);
  local_120._M_dataplus._M_p._0_1_ = 0xe;
  local_120._M_dataplus._M_p._4_4_ = 6;
  local_120._M_string_length = 0x111063;
  iVar5 = 4;
  attrName_03._M_str = "bart";
  attrName_03._M_len = 4;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&b,attrName_03,(Value *)&local_120);
  arangodb::velocypack::Builder::close(&b,iVar5);
  local_120._M_dataplus._M_p._0_1_ = 0xb;
  local_120._M_dataplus._M_p._4_4_ = 3;
  local_120._M_string_length = 0x3039;
  iVar5 = 4;
  attrName_04._M_str = "quux";
  attrName_04._M_len = 4;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&b,attrName_04,(Value *)&local_120);
  arangodb::velocypack::Builder::close(&b,iVar5);
  s._start = arangodb::velocypack::Builder::start(&b);
  attribute._M_str = "bar";
  attribute._M_len = 3;
  bVar1 = arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
          ::hasKey((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&s,
                   attribute);
  if (bVar1) {
    attribute_00._M_str = "bar";
    attribute_00._M_len = 3;
    SVar2 = arangodb::velocypack::
            SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::get
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&s,
                       attribute_00);
    poVar3 = std::operator<<((ostream *)&std::cout,"\'bar\' attribute value has type: ");
    poVar3 = operator<<(poVar3,arangodb::velocypack::SliceStaticData::TypeMap[*SVar2._start]);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  attribute_01._M_str = "quetzal";
  attribute_01._M_len = 7;
  SVar2 = arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
          ::get((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&s,
                attribute_01);
  poVar3 = std::operator<<((ostream *)&std::cout,"\'quetzal\' attribute value has type: ");
  poVar3 = operator<<(poVar3,arangodb::velocypack::SliceStaticData::TypeMap[*SVar2._start]);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"\'quetzal\' attribute is None: ");
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) | 1;
  poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"baz",(allocator<char> *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>(local_100,"qux",&local_141);
  __l._M_len = 2;
  __l._M_array = &local_120;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_138,__l,&local_142);
  qux = arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
        get<std::__cxx11::string>
                  ((SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *)&s,
                   &local_138,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  lVar4 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_120._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  poVar3 = std::operator<<((ostream *)&std::cout,"\'baz\'.\'qux\' attribute has type: ");
  poVar3 = operator<<(poVar3,arangodb::velocypack::SliceStaticData::TypeMap[*qux._start]);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"\'baz\'.\'qux\' attribute has bool value: ");
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) | 1;
  arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getBool
            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&qux);
  poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Complete value of \'baz\' is: ");
  attribute_02._M_str = "baz";
  attribute_02._M_len = 3;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)arangodb::velocypack::
                SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::get
                          ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&s
                           ,attribute_02);
  arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
  toJson_abi_cxx11_(&local_120,
                    (SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *)&local_138
                    ,&arangodb::velocypack::Options::Defaults);
  poVar3 = std::operator<<(poVar3,(string *)&local_120);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"bark",(allocator<char> *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>(local_100,"foobar",&local_141);
  __l_00._M_len = 2;
  __l_00._M_array = &local_120;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_138,__l_00,&local_142);
  arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
  get<std::__cxx11::string>
            ((SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *)&s,&local_138,
             false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  lVar4 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_120._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  poVar3 = std::operator<<((ostream *)&std::cout,"\'bark\'.\'foobar\' attribute is None: ");
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) | 1;
  poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"baz",(allocator<char> *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>(local_100,"bart",&local_141);
  __l_01._M_len = 2;
  __l_01._M_array = &local_120;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_138,__l_01,&local_142);
  bVar1 = arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
          hasKey<std::__cxx11::string>
                    ((SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *)&s,
                     &local_138);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  lVar4 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_120._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"\'baz\'.\'bart\' attribute has type: ");
    attribute_03._M_str = "baz";
    attribute_03._M_len = 3;
    local_120._M_dataplus._M_p =
         (pointer)arangodb::velocypack::
                  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::get
                            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                             &s,attribute_03);
    attribute_04._M_str = "bart";
    attribute_04._M_len = 4;
    SVar2 = arangodb::velocypack::
            SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::get
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &local_120,attribute_04);
    poVar3 = operator<<(poVar3,arangodb::velocypack::SliceStaticData::TypeMap[*SVar2._start]);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"\'baz\'.\'bart\' attribute has value: \'");
    attribute_05._M_str = "baz";
    attribute_05._M_len = 3;
    local_e0 = (uint8_t *)
               arangodb::velocypack::
               SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::get
                         ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&s,
                          attribute_05);
    attribute_06._M_str = "bart";
    attribute_06._M_len = 4;
    local_138.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)arangodb::velocypack::
                  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::get
                            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                             &local_e0,attribute_06);
    arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
    copyString_abi_cxx11_
              (&local_120,
               (SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *)&local_138);
    poVar3 = std::operator<<(poVar3,(string *)&local_120);
    poVar3 = std::operator<<(poVar3,"\'");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_120);
  }
  arangodb::velocypack::Builder::~Builder(&b);
  return 0;
}

Assistant:

int main(int, char*[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  // create an object with a few members
  Builder b;

  b(Value(ValueType::Object));
  b.add("foo", Value(42));
  b.add("bar", Value("some string value"));
  b.add("baz", Value(ValueType::Object));
  b.add("qux", Value(true));
  b.add("bart", Value("this is a string"));
  b.close();
  b.add("quux", Value(12345));
  b.close();

  // a Slice is a lightweight accessor for a VPack value
  Slice s(b.start());

  // now fetch the string in the object's "bar" attribute
  if (s.hasKey("bar")) {
    Slice bar(s.get("bar"));
    std::cout << "'bar' attribute value has type: " << bar.type() << std::endl;
  }

  // fetch non-existing attribute "quetzal"
  Slice quetzal(s.get("quetzal"));
  // note: this returns a slice of type None
  std::cout << "'quetzal' attribute value has type: " << quetzal.type()
            << std::endl;
  std::cout << "'quetzal' attribute is None: " << std::boolalpha
            << quetzal.isNone() << std::endl;

  // fetch subattribute "baz.qux"
  Slice qux(s.get(std::vector<std::string>({"baz", "qux"})));
  std::cout << "'baz'.'qux' attribute has type: " << qux.type() << std::endl;
  std::cout << "'baz'.'qux' attribute has bool value: " << std::boolalpha
            << qux.getBoolean() << std::endl;
  std::cout << "Complete value of 'baz' is: " << s.get("baz").toJson()
            << std::endl;

  // fetch non-existing subattribute "bark.foobar"
  Slice foobar(s.get(std::vector<std::string>({"bark", "foobar"})));
  std::cout << "'bark'.'foobar' attribute is None: " << std::boolalpha
            << foobar.isNone() << std::endl;

  // check if subattribute "baz"."bart" does exist
  if (s.hasKey(std::vector<std::string>({"baz", "bart"}))) {
    // access subattribute using operator syntax
    std::cout << "'baz'.'bart' attribute has type: " << s["baz"]["bart"].type()
              << std::endl;
    std::cout << "'baz'.'bart' attribute has value: '"
              << s["baz"]["bart"].copyString() << "'" << std::endl;
  }

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}